

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

string * __thiscall
libtorrent::lexically_relative_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,string_view base,string_view target)

{
  bool bVar1;
  size_t __n;
  aux *paVar2;
  aux *paVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  aux *paVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  string_view last;
  string_view last_00;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_70;
  char *local_50;
  aux *local_48;
  char *local_40;
  aux *local_38;
  
  pcVar9 = (char *)target._M_len;
  paVar7 = (aux *)base._M_str;
  pcVar5 = (char *)base._M_len;
  if (this != (libtorrent *)0x0) {
    this = this + -(ulong)((pcVar5 + -1)[(long)this] == '/');
  }
  pcVar11 = pcVar9;
  if (paVar7 != (aux *)0x0) {
    paVar7 = paVar7 + -(ulong)((pcVar9 + -1)[(long)paVar7] == '/');
  }
  do {
    pcVar8 = pcVar11;
    pcVar10 = pcVar5;
    if (this == (libtorrent *)0x0) break;
    last._M_str = (char *)0x2f;
    last._M_len = (size_t)pcVar5;
    local_38 = (aux *)this;
    aux::split_string(&local_70,(aux *)this,last,(char)pcVar9);
    pcVar10 = local_70.second._M_str;
    this = (libtorrent *)local_70.second._M_len;
    __n = local_70.first._M_len;
    local_40 = local_70.first._M_str;
    last_00._M_str = (char *)0x2f;
    last_00._M_len = (size_t)pcVar11;
    aux::split_string(&local_70,paVar7,last_00,(char)pcVar9);
    paVar2 = local_38;
    if (__n == local_70.first._M_len) {
      bVar1 = true;
      pcVar8 = local_70.second._M_str;
      paVar3 = (aux *)local_70.second._M_len;
      if (__n != 0) {
        local_48 = (aux *)local_70.second._M_len;
        local_50 = local_70.second._M_str;
        iVar4 = bcmp(local_40,local_70.first._M_str,__n);
        bVar1 = true;
        pcVar8 = local_50;
        paVar3 = local_48;
        if (iVar4 != 0) goto LAB_0023f6b0;
      }
    }
    else {
LAB_0023f6b0:
      bVar1 = false;
      pcVar8 = pcVar11;
      this = (libtorrent *)paVar2;
      paVar3 = paVar7;
      pcVar10 = pcVar5;
    }
    paVar7 = paVar3;
    pcVar11 = pcVar8;
    pcVar5 = pcVar10;
  } while (bVar1);
  if (this == (libtorrent *)0x0) {
    iVar4 = 0;
  }
  else {
    paVar7 = (aux *)0x0;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + (uint)(pcVar10[(long)paVar7] == '/');
      paVar7 = paVar7 + 1;
    } while (this != (libtorrent *)paVar7);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar6 = (uint)(this != (libtorrent *)0x0) + iVar4;
  if (iVar6 != 0 && SCARRY4((uint)(this != (libtorrent *)0x0),iVar4) == iVar6 < 0) {
    do {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar8);
  return __return_storage_ptr__;
}

Assistant:

std::string lexically_relative(string_view base, string_view target)
	{
		// first, strip trailing directory separators
		if (!base.empty() && base.back() == TORRENT_SEPARATOR_CHAR)
			base.remove_suffix(1);
		if (!target.empty() && target.back() == TORRENT_SEPARATOR_CHAR)
			target.remove_suffix(1);

		// strip common path elements
		for (;;)
		{
			if (base.empty()) break;
			string_view prev_base = base;
			string_view prev_target = target;

			string_view base_element;
			string_view target_element;
			std::tie(base_element, base) = aux::split_string(base, TORRENT_SEPARATOR_CHAR);
			std::tie(target_element, target) = aux::split_string(target, TORRENT_SEPARATOR_CHAR);
			if (base_element == target_element) continue;

			base = prev_base;
			target = prev_target;
			break;
		}

		// count number of path elements left in base, and prepend that number of
		// "../" to target

		// base always points to a directory. There's an implied directory
		// separator at the end of it
		int const num_steps = static_cast<int>(std::count(
			base.begin(), base.end(), TORRENT_SEPARATOR_CHAR)) + (base.empty() ? 0 : 1);
		std::string ret;
		for (int i = 0; i < num_steps; ++i)
			ret += ".." TORRENT_SEPARATOR;

		ret += target;
		return ret;
	}